

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O0

bool __thiscall
ON_OBSOLETE_V5_Leader::GetTightBoundingBox
          (ON_OBSOLETE_V5_Leader *this,ON_BoundingBox *tight_bbox,bool bGrowBox,ON_Xform *xform)

{
  bool bVar1;
  ON_2dPoint *pOVar2;
  ON_3dPoint local_90;
  double dStack_68;
  ON_2dPoint uv;
  int local_4c;
  undefined1 local_48 [4];
  int i;
  ON_3dPointArray P;
  int point_count;
  ON_Xform *xform_local;
  bool bGrowBox_local;
  ON_BoundingBox *tight_bbox_local;
  ON_OBSOLETE_V5_Leader *this_local;
  
  P.super_ON_SimpleArray<ON_3dPoint>.m_capacity =
       ON_SimpleArray<ON_2dPoint>::Count
                 (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>
                 );
  xform_local._7_1_ = bGrowBox;
  if (P.super_ON_SimpleArray<ON_3dPoint>.m_capacity < 2) {
    if ((bGrowBox) && (bVar1 = ON_BoundingBox::IsValid(tight_bbox), !bVar1)) {
      ON_BoundingBox::Destroy(tight_bbox);
      xform_local._7_1_ = 0;
    }
  }
  else {
    ON_3dPointArray::ON_3dPointArray
              ((ON_3dPointArray *)local_48,P.super_ON_SimpleArray<ON_3dPoint>.m_capacity);
    for (local_4c = 0; local_4c < P.super_ON_SimpleArray<ON_3dPoint>.m_capacity;
        local_4c = local_4c + 1) {
      pOVar2 = ON_SimpleArray<ON_2dPoint>::operator[]
                         (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                           super_ON_SimpleArray<ON_2dPoint>,local_4c);
      dStack_68 = pOVar2->x;
      uv.x = pOVar2->y;
      ON_Plane::PointAt(&local_90,&(this->super_ON_OBSOLETE_V5_Annotation).m_plane,dStack_68,uv.x);
      ON_SimpleArray<ON_3dPoint>::Append((ON_SimpleArray<ON_3dPoint> *)local_48,&local_90);
    }
    bVar1 = ON_3dPointArray::GetTightBoundingBox
                      ((ON_3dPointArray *)local_48,tight_bbox,bGrowBox,xform);
    if (bVar1) {
      xform_local._7_1_ = 1;
    }
    ON_3dPointArray::~ON_3dPointArray((ON_3dPointArray *)local_48);
  }
  return (xform_local._7_1_ & 1) != 0;
}

Assistant:

bool ON_OBSOLETE_V5_Leader::GetTightBoundingBox( 
		ON_BoundingBox& tight_bbox, 
    bool bGrowBox,
		const ON_Xform* xform
    ) const
{
  const int point_count = m_points.Count();
  if ( point_count >= 2 )
  {
    ON_3dPointArray P(point_count);
    int i;
    for ( i = 0; i < point_count; i++ )
    {
      ON_2dPoint uv = m_points[i];
      P.Append( m_plane.PointAt(uv.x,uv.y));
    }
    if ( P.GetTightBoundingBox( tight_bbox, bGrowBox, xform ) )
      bGrowBox = true;
  }
  else if ( bGrowBox && !tight_bbox.IsValid() )
  {
    tight_bbox.Destroy();
    bGrowBox = false;
  }

  return (0!=bGrowBox);
}